

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O1

long __thiscall
gl4cts::anon_unknown_0::PlainGatherIntCubeArray::VerifyCompute(PlainGatherIntCubeArray *this)

{
  double dVar1;
  long lVar2;
  long lVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  float local_58;
  uint auStack_54 [3];
  undefined1 local_48 [12];
  float local_3c;
  undefined1 local_38 [8];
  float local_30;
  undefined1 local_28 [4];
  float local_24;
  
  puVar4 = (uint *)glu::CallLogWrapper::glMapBufferRange
                             (&(this->super_GatherBase).super_TGBase.super_SubcaseBase.
                               super_GLWrapper.super_CallLogWrapper,0x90d2,0,0x10,1);
  local_58 = 0.0;
  auStack_54[0] = 4;
  auStack_54[1] = 8;
  auStack_54[2] = 0xc;
  if (*puVar4 == 0) {
    uVar5 = 0xffffffffffffffff;
    do {
      if (uVar5 == 2) {
        uVar6 = 3;
        break;
      }
      lVar2 = uVar5 + 2;
      uVar6 = uVar5 + 1;
      lVar3 = uVar5 + 1;
      uVar5 = uVar6;
    } while (puVar4[lVar2] == auStack_54[lVar3]);
    if (2 < uVar6) {
      return 0;
    }
  }
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
            (&local_58,this);
  dVar1 = (double)local_58;
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
            (local_28,this);
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
            (local_38,this);
  (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x20])
            (local_48,this);
  anon_unknown_0::Output
            ("Expected %d, %d, %d, %d, got: %d, %d, %d, %d",SUB84(dVar1,0),(double)local_24,
             (double)local_30,(double)local_3c,(ulong)*puVar4,(ulong)puVar4[1],(ulong)puVar4[2],
             (ulong)puVar4[3]);
  return -1;
}

Assistant:

virtual long VerifyCompute()
	{
		IVec4* data;
		data = static_cast<IVec4*>(glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(IVec4), GL_MAP_READ_BIT));
		if (data[0] != IVec4(0, 4, 8, 12))
		{
			Output("Expected %d, %d, %d, %d, got: %d, %d, %d, %d", Expected().x(), Expected().y(), Expected().z(),
				   Expected().w(), data[0].x(), data[0].y(), data[0].z(), data[0].w());
			return ERROR;
		}
		return NO_ERROR;
	}